

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coap.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::coap::Message::GetContentFormat
          (Error *__return_storage_ptr__,Message *this,ContentFormat *aContentFormat)

{
  ErrorCode EVar1;
  Error *pEVar2;
  uint32_t value;
  undefined1 local_48 [40];
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  GetOption((Error *)local_48,this,&value,kContentFormat);
  pEVar2 = Error::operator=(__return_storage_ptr__,(Error *)local_48);
  EVar1 = pEVar2->mCode;
  std::__cxx11::string::~string((string *)(local_48 + 8));
  if (EVar1 == kNone) {
    *aContentFormat = value;
  }
  return __return_storage_ptr__;
}

Assistant:

Error Message::GetContentFormat(ContentFormat &aContentFormat) const
{
    Error    error;
    uint32_t value;

    SuccessOrExit(error = GetOption(value, OptionType::kContentFormat));
    aContentFormat = utils::from_underlying<ContentFormat>(value);

exit:
    return error;
}